

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

int key_type_s(BinarySource *src)

{
  int iVar1;
  _Bool _Var2;
  ssh_keyalg *psVar3;
  ptrlen realsig;
  ptrlen realsig_00;
  ptrlen realsig_01;
  ptrlen realsig_02;
  ptrlen realsig_03;
  ptrlen pVar4;
  
  BinarySource_REWIND_TO__(src->binarysource_,0);
  pVar4.len = 0x21;
  pVar4.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var2 = expect_signature(src,pVar4);
  if (_Var2) {
    iVar1 = 2;
  }
  else {
    BinarySource_REWIND_TO__(src->binarysource_,0);
    realsig.len = 0x1a;
    realsig.ptr = "---- BEGIN SSH2 PUBLIC KEY";
    _Var2 = expect_signature(src,realsig);
    if (_Var2) {
      iVar1 = 9;
    }
    else {
      BinarySource_REWIND_TO__(src->binarysource_,0);
      realsig_00.len = 0x14;
      realsig_00.ptr = "PuTTY-User-Key-File-";
      _Var2 = expect_signature(src,realsig_00);
      if (_Var2) {
        iVar1 = 3;
      }
      else {
        BinarySource_REWIND_TO__(src->binarysource_,0);
        realsig_01.len = 0x1e;
        realsig_01.ptr = "-----BEGIN OPENSSH PRIVATE KEY";
        _Var2 = expect_signature(src,realsig_01);
        if (_Var2) {
          iVar1 = 6;
        }
        else {
          BinarySource_REWIND_TO__(src->binarysource_,0);
          realsig_02.len = 0xb;
          realsig_02.ptr = "-----BEGIN ";
          _Var2 = expect_signature(src,realsig_02);
          if (_Var2) {
            iVar1 = 5;
          }
          else {
            BinarySource_REWIND_TO__(src->binarysource_,0);
            realsig_03.len = 0x20;
            realsig_03.ptr = "---- BEGIN SSH2 ENCRYPTED PRIVAT";
            _Var2 = expect_signature(src,realsig_03);
            if (_Var2) {
              iVar1 = 7;
            }
            else {
              BinarySource_REWIND_TO__(src->binarysource_,0);
              pVar4 = BinarySource_get_chars(src->binarysource_,"0123456789");
              if (pVar4.len != 0) {
                pVar4 = BinarySource_get_chars(src->binarysource_," ");
                if (pVar4.len == 1) {
                  pVar4 = BinarySource_get_chars(src->binarysource_,"0123456789");
                  if (pVar4.len != 0) {
                    pVar4 = BinarySource_get_chars(src->binarysource_," ");
                    if (pVar4.len == 1) {
                      pVar4 = BinarySource_get_chars(src->binarysource_,"0123456789");
                      if (pVar4.len != 0) {
                        pVar4 = BinarySource_get_nonchars(src->binarysource_," \n");
                        if (pVar4.len == 0) {
                          iVar1 = 8;
                          goto LAB_0012844a;
                        }
                      }
                    }
                  }
                }
              }
              BinarySource_REWIND_TO__(src->binarysource_,0);
              pVar4 = BinarySource_get_nonchars(src->binarysource_," \n");
              psVar3 = find_pubkey_alg_len(pVar4);
              if (psVar3 != (ssh_keyalg *)0x0) {
                pVar4 = BinarySource_get_chars(src->binarysource_," ");
                if (pVar4.len == 1) {
                  pVar4 = BinarySource_get_chars
                                    (src->binarysource_,
                                     "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz+/="
                                    );
                  if (pVar4.len != 0) {
                    pVar4 = BinarySource_get_nonchars(src->binarysource_," \n");
                    if (pVar4.len == 0) {
                      iVar1 = 10;
                      goto LAB_0012844a;
                    }
                  }
                }
              }
              iVar1 = 1;
            }
          }
        }
      }
    }
  }
LAB_0012844a:
  BinarySource_REWIND_TO__(src->binarysource_,0);
  return iVar1;
}

Assistant:

int key_type_s(BinarySource *src)
{
    int toret = key_type_s_internal(src);
    BinarySource_REWIND(src);
    return toret;
}